

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_file_extended_header
                  (archive_read *a,lha *lha,uint16_t *crc,wchar_t sizefield_length,size_t limitsize,
                  size_t *total_size)

{
  uint16_t uVar1;
  wchar_t wVar2;
  uint uVar3;
  uint32_t uVar4;
  void *pvVar5;
  ulong n;
  char *pp;
  time_t tVar6;
  uint64_t uVar7;
  archive_string_conv *paVar8;
  char *local_88;
  char *charset;
  archive_string cp;
  uchar extdtype;
  uint i;
  size_t datasize;
  size_t extdsize;
  uchar *extdheader;
  void *h;
  size_t *total_size_local;
  size_t limitsize_local;
  wchar_t sizefield_length_local;
  uint16_t *crc_local;
  lha *lha_local;
  archive_read *a_local;
  
  *total_size = (long)sizefield_length;
  do {
    pvVar5 = __archive_read_ahead(a,(long)sizefield_length,(ssize_t *)0x0);
    if (pvVar5 == (void *)0x0) {
      wVar2 = truncated_error(a);
      return wVar2;
    }
    if (sizefield_length == L'\x02') {
      uVar1 = archive_le16dec(pvVar5);
      datasize = (size_t)uVar1;
    }
    else {
      uVar4 = archive_le32dec(pvVar5);
      datasize = (size_t)uVar4;
    }
    if (datasize == 0) {
      if (crc != (uint16_t *)0x0) {
        uVar1 = lha_crc16(*crc,pvVar5,(long)sizefield_length);
        *crc = uVar1;
      }
      __archive_read_consume(a,(long)sizefield_length);
      return L'\0';
    }
    if ((limitsize < *total_size + datasize) || (datasize <= (ulong)(long)sizefield_length))
    goto LAB_006925f0;
    pvVar5 = __archive_read_ahead(a,datasize,(ssize_t *)0x0);
    if (pvVar5 == (void *)0x0) {
      wVar2 = truncated_error(a);
      return wVar2;
    }
    *total_size = datasize + *total_size;
    cp.buffer_length._3_1_ = *(byte *)((long)pvVar5 + (long)sizefield_length);
    n = datasize - (long)(sizefield_length + L'\x01');
    pp = (char *)((long)pvVar5 + (long)(sizefield_length + L'\x01'));
    if ((crc != (uint16_t *)0x0) && (cp.buffer_length._3_1_ != 0)) {
      uVar1 = lha_crc16(*crc,pvVar5,datasize);
      *crc = uVar1;
    }
    uVar3 = (uint)cp.buffer_length._3_1_;
    if (uVar3 == 0) {
      if (1 < n) {
        uVar1 = archive_le16dec(pp);
        lha->header_crc = uVar1;
        if (crc != (uint16_t *)0x0) {
          uVar1 = lha_crc16(*crc,pvVar5,datasize - n);
          *crc = uVar1;
          uVar1 = lha_crc16(*crc,"",2);
          *crc = uVar1;
          uVar1 = lha_crc16(*crc,pp + 2,n - 2);
          *crc = uVar1;
        }
      }
    }
    else if (uVar3 == 1) {
      if (n == 0) {
        (lha->filename).length = 0;
      }
      else {
        if (*pp == '\0') goto LAB_006925f0;
        (lha->filename).length = 0;
        archive_strncat(&lha->filename,pp,n);
      }
    }
    else if (uVar3 == 2) {
      if ((n == 0) || (*pp == '\0')) {
LAB_006925f0:
        archive_set_error(&a->archive,0x54,"Invalid extended LHa header");
        return L'\xffffffe2';
      }
      (lha->dirname).length = 0;
      archive_strncat(&lha->dirname,pp,n);
      for (cp.buffer_length._4_4_ = 0; (ulong)cp.buffer_length._4_4_ < (lha->dirname).length;
          cp.buffer_length._4_4_ = cp.buffer_length._4_4_ + 1) {
        if ((lha->dirname).s[cp.buffer_length._4_4_] == -1) {
          (lha->dirname).s[cp.buffer_length._4_4_] = '/';
        }
      }
      if ((lha->dirname).s[(lha->dirname).length - 1] != '/') goto LAB_006925f0;
    }
    else if (uVar3 == 0x40) {
      if (n == 2) {
        uVar1 = archive_le16dec(pp);
        lha->dos_attr = (uchar)uVar1;
      }
    }
    else if (uVar3 == 0x41) {
      if (n == 0x18) {
        uVar7 = archive_le64dec(pp);
        tVar6 = lha_win_time(uVar7,&lha->birthtime_tv_nsec);
        lha->birthtime = tVar6;
        uVar7 = archive_le64dec(pp + 8);
        tVar6 = lha_win_time(uVar7,&lha->mtime_tv_nsec);
        lha->mtime = tVar6;
        uVar7 = archive_le64dec(pp + 0x10);
        tVar6 = lha_win_time(uVar7,&lha->atime_tv_nsec);
        lha->atime = tVar6;
        lha->setflag = lha->setflag | 3;
      }
    }
    else if (uVar3 == 0x42) {
      if (n == 0x10) {
        uVar7 = archive_le64dec(pp);
        lha->compsize = uVar7;
        uVar7 = archive_le64dec(pp + 8);
        lha->origsize = uVar7;
      }
    }
    else if (2 < uVar3 - 0x43) {
      if (uVar3 == 0x46) {
        if (n == 4) {
          charset = (char *)0x0;
          cp.s = (char *)0x0;
          cp.length = 0;
          uVar4 = archive_le32dec(pp);
          if (uVar4 == 0xfde9) {
            local_88 = "UTF-8";
          }
          else {
            uVar4 = archive_le32dec(pp);
            archive_string_sprintf((archive_string *)&charset,"CP%d",(ulong)uVar4);
            local_88 = charset;
          }
          paVar8 = archive_string_conversion_from_charset(&a->archive,local_88,L'\x01');
          lha->sconv = paVar8;
          archive_string_free((archive_string *)&charset);
          if (lha->sconv == (archive_string_conv *)0x0) {
            return L'\xffffffe2';
          }
        }
      }
      else if (uVar3 == 0x50) {
        if (n == 2) {
          uVar1 = archive_le16dec(pp);
          lha->mode = (uint)uVar1;
          lha->setflag = lha->setflag | 4;
        }
      }
      else if (uVar3 == 0x51) {
        if (n == 4) {
          uVar1 = archive_le16dec(pp);
          lha->gid = (ulong)uVar1;
          uVar1 = archive_le16dec(pp + 2);
          lha->uid = (ulong)uVar1;
        }
      }
      else if (uVar3 == 0x52) {
        if (n != 0) {
          (lha->gname).length = 0;
          archive_strncat(&lha->gname,pp,n);
        }
      }
      else if (uVar3 == 0x53) {
        if (n != 0) {
          (lha->uname).length = 0;
          archive_strncat(&lha->uname,pp,n);
        }
      }
      else if (uVar3 == 0x54) {
        if (n == 4) {
          uVar4 = archive_le32dec(pp);
          lha->mtime = (ulong)uVar4;
        }
      }
      else if (uVar3 == 0x7f) {
        if (n == 0x10) {
          uVar1 = archive_le16dec(pp);
          lha->dos_attr = (uchar)uVar1;
          uVar1 = archive_le16dec(pp + 2);
          lha->mode = (uint)uVar1;
          uVar1 = archive_le16dec(pp + 4);
          lha->gid = (ulong)uVar1;
          uVar1 = archive_le16dec(pp + 6);
          lha->uid = (ulong)uVar1;
          uVar4 = archive_le32dec(pp + 8);
          lha->birthtime = (ulong)uVar4;
          uVar4 = archive_le32dec(pp + 0xc);
          lha->atime = (ulong)uVar4;
          lha->setflag = lha->setflag | 7;
        }
      }
      else if ((uVar3 == 0xff) && (n == 0x14)) {
        uVar4 = archive_le32dec(pp);
        lha->mode = uVar4;
        uVar4 = archive_le32dec(pp + 4);
        lha->gid = (ulong)uVar4;
        uVar4 = archive_le32dec(pp + 8);
        lha->uid = (ulong)uVar4;
        uVar4 = archive_le32dec(pp + 0xc);
        lha->birthtime = (ulong)uVar4;
        uVar4 = archive_le32dec(pp + 0x10);
        lha->atime = (ulong)uVar4;
        lha->setflag = lha->setflag | 7;
      }
    }
    __archive_read_consume(a,datasize);
  } while( true );
}

Assistant:

static int
lha_read_file_extended_header(struct archive_read *a, struct lha *lha,
    uint16_t *crc, int sizefield_length, size_t limitsize, size_t *total_size)
{
	const void *h;
	const unsigned char *extdheader;
	size_t	extdsize;
	size_t	datasize;
	unsigned int i;
	unsigned char extdtype;

#define EXT_HEADER_CRC		0x00		/* Header CRC and information*/
#define EXT_FILENAME		0x01		/* Filename 		    */
#define EXT_DIRECTORY		0x02		/* Directory name	    */
#define EXT_DOS_ATTR		0x40		/* MS-DOS attribute	    */
#define EXT_TIMESTAMP		0x41		/* Windows time stamp	    */
#define EXT_FILESIZE		0x42		/* Large file size	    */
#define EXT_TIMEZONE		0x43		/* Time zone		    */
#define EXT_UTF16_FILENAME	0x44		/* UTF-16 filename 	    */
#define EXT_UTF16_DIRECTORY	0x45		/* UTF-16 directory name    */
#define EXT_CODEPAGE		0x46		/* Codepage		    */
#define EXT_UNIX_MODE		0x50		/* File permission	    */
#define EXT_UNIX_GID_UID	0x51		/* gid,uid		    */
#define EXT_UNIX_GNAME		0x52		/* Group name		    */
#define EXT_UNIX_UNAME		0x53		/* User name		    */
#define EXT_UNIX_MTIME		0x54		/* Modified time	    */
#define EXT_OS2_NEW_ATTR	0x7f		/* new attribute(OS/2 only) */
#define EXT_NEW_ATTR		0xff		/* new attribute	    */

	*total_size = sizefield_length;

	for (;;) {
		/* Read an extended header size. */
		if ((h =
		    __archive_read_ahead(a, sizefield_length, NULL)) == NULL)
			return (truncated_error(a));
		/* Check if the size is the zero indicates the end of the
		 * extended header. */
		if (sizefield_length == sizeof(uint16_t))
			extdsize = archive_le16dec(h);
		else
			extdsize = archive_le32dec(h);
		if (extdsize == 0) {
			/* End of extended header */
			if (crc != NULL)
				*crc = lha_crc16(*crc, h, sizefield_length);
			__archive_read_consume(a, sizefield_length);
			return (ARCHIVE_OK);
		}

		/* Sanity check to the extended header size. */
		if (((uint64_t)*total_size + extdsize) >
				    (uint64_t)limitsize ||
		    extdsize <= (size_t)sizefield_length)
			goto invalid;

		/* Read the extended header. */
		if ((h = __archive_read_ahead(a, extdsize, NULL)) == NULL)
			return (truncated_error(a));
		*total_size += extdsize;

		extdheader = (const unsigned char *)h;
		/* Get the extended header type. */
		extdtype = extdheader[sizefield_length];
		/* Calculate an extended data size. */
		datasize = extdsize - (1 + sizefield_length);
		/* Skip an extended header size field and type field. */
		extdheader += sizefield_length + 1;

		if (crc != NULL && extdtype != EXT_HEADER_CRC)
			*crc = lha_crc16(*crc, h, extdsize);
		switch (extdtype) {
		case EXT_HEADER_CRC:
			/* We only use a header CRC. Following data will not
			 * be used. */
			if (datasize >= 2) {
				lha->header_crc = archive_le16dec(extdheader);
				if (crc != NULL) {
					static const char zeros[2] = {0, 0};
					*crc = lha_crc16(*crc, h,
					    extdsize - datasize);
					/* CRC value itself as zero */
					*crc = lha_crc16(*crc, zeros, 2);
					*crc = lha_crc16(*crc,
					    extdheader+2, datasize - 2);
				}
			}
			break;
		case EXT_FILENAME:
			if (datasize == 0) {
				/* maybe directory header */
				archive_string_empty(&lha->filename);
				break;
			}
			if (extdheader[0] == '\0')
				goto invalid;
			archive_strncpy(&lha->filename,
			    (const char *)extdheader, datasize);
			break;
		case EXT_DIRECTORY:
			if (datasize == 0 || extdheader[0] == '\0')
				/* no directory name data. exit this case. */
				goto invalid;

			archive_strncpy(&lha->dirname,
		  	    (const char *)extdheader, datasize);
			/*
			 * Convert directory delimiter from 0xFF
			 * to '/' for local system.
	 		 */
			for (i = 0; i < lha->dirname.length; i++) {
				if ((unsigned char)lha->dirname.s[i] == 0xFF)
					lha->dirname.s[i] = '/';
			}
			/* Is last character directory separator? */
			if (lha->dirname.s[lha->dirname.length-1] != '/')
				/* invalid directory data */
				goto invalid;
			break;
		case EXT_DOS_ATTR:
			if (datasize == 2)
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
			break;
		case EXT_TIMESTAMP:
			if (datasize == (sizeof(uint64_t) * 3)) {
				lha->birthtime = lha_win_time(
				    archive_le64dec(extdheader),
				    &lha->birthtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				lha->mtime = lha_win_time(
				    archive_le64dec(extdheader),
				    &lha->mtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				lha->atime = lha_win_time(
				    archive_le64dec(extdheader),
				    &lha->atime_tv_nsec);
				lha->setflag |= BIRTHTIME_IS_SET |
				    ATIME_IS_SET;
			}
			break;
		case EXT_FILESIZE:
			if (datasize == sizeof(uint64_t) * 2) {
				lha->compsize = archive_le64dec(extdheader);
				extdheader += sizeof(uint64_t);
				lha->origsize = archive_le64dec(extdheader);
			}
			break;
		case EXT_CODEPAGE:
			/* Get an archived filename charset from codepage.
			 * This overwrites the charset specified by
			 * hdrcharset option. */
			if (datasize == sizeof(uint32_t)) {
				struct archive_string cp;
				const char *charset;

				archive_string_init(&cp);
				switch (archive_le32dec(extdheader)) {
				case 65001: /* UTF-8 */
					charset = "UTF-8";
					break;
				default:
					archive_string_sprintf(&cp, "CP%d",
					    (int)archive_le32dec(extdheader));
					charset = cp.s;
					break;
				}
				lha->sconv =
				    archive_string_conversion_from_charset(
					&(a->archive), charset, 1);
				archive_string_free(&cp);
				if (lha->sconv == NULL)
					return (ARCHIVE_FATAL);
			}
			break;
		case EXT_UNIX_MODE:
			if (datasize == sizeof(uint16_t)) {
				lha->mode = archive_le16dec(extdheader);
				lha->setflag |= UNIX_MODE_IS_SET;
			}
			break;
		case EXT_UNIX_GID_UID:
			if (datasize == (sizeof(uint16_t) * 2)) {
				lha->gid = archive_le16dec(extdheader);
				lha->uid = archive_le16dec(extdheader+2);
			}
			break;
		case EXT_UNIX_GNAME:
			if (datasize > 0)
				archive_strncpy(&lha->gname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_UNAME:
			if (datasize > 0)
				archive_strncpy(&lha->uname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_MTIME:
			if (datasize == sizeof(uint32_t))
				lha->mtime = archive_le32dec(extdheader);
			break;
		case EXT_OS2_NEW_ATTR:
			/* This extended header is OS/2 depend. */
			if (datasize == 16) {
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
				lha->mode = archive_le16dec(extdheader+2);
				lha->gid = archive_le16dec(extdheader+4);
				lha->uid = archive_le16dec(extdheader+6);
				lha->birthtime = archive_le32dec(extdheader+8);
				lha->atime = archive_le32dec(extdheader+12);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_NEW_ATTR:
			if (datasize == 20) {
				lha->mode = (mode_t)archive_le32dec(extdheader);
				lha->gid = archive_le32dec(extdheader+4);
				lha->uid = archive_le32dec(extdheader+8);
				lha->birthtime = archive_le32dec(extdheader+12);
				lha->atime = archive_le32dec(extdheader+16);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_TIMEZONE:		/* Not supported */
		case EXT_UTF16_FILENAME:	/* Not supported */
		case EXT_UTF16_DIRECTORY:	/* Not supported */
		default:
			break;
		}

		__archive_read_consume(a, extdsize);
	}
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid extended LHa header");
	return (ARCHIVE_FATAL);
}